

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.cpp
# Opt level: O0

int anon_unknown.dwarf_26820::run_rearrangement(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  ostream *poVar4;
  pointer pDVar5;
  long in_RSI;
  int in_EDI;
  double dVar6;
  ofstream ofs;
  string dic_name;
  StopWatch sw;
  char rear_mode;
  unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> dic;
  ostream *in_stack_fffffffffffffcb0;
  string *in_stack_fffffffffffffcb8;
  undefined8 in_stack_fffffffffffffce8;
  Times type;
  allocator *paVar7;
  StopWatch *in_stack_fffffffffffffcf0;
  long local_2d0 [8];
  undefined1 in_stack_fffffffffffffd77;
  unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *in_stack_fffffffffffffd78;
  ostream *in_stack_fffffffffffffd80;
  allocator local_c9;
  string local_c8 [32];
  string local_a8 [32];
  string *in_stack_ffffffffffffff78;
  string local_80 [32];
  StopWatch local_60;
  char local_51;
  uint local_50;
  allocator local_39;
  string local_38 [40];
  long local_10;
  int local_8;
  int local_4;
  
  type = (Times)((ulong)in_stack_fffffffffffffce8 >> 0x20);
  local_10 = in_RSI;
  local_8 = in_EDI;
  poVar4 = std::operator<<((ostream *)&std::cout,"run rearrangement");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  if (local_8 < 5) {
    show_usage((ostream *)0x14b05e);
    return 1;
  }
  pcVar1 = *(char **)(local_10 + 0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar1,&local_39);
  read_dic(in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)0x14b0ee)
  ;
  if (bVar2) {
    show_stat(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,(bool)in_stack_fffffffffffffd77);
    local_51 = **(char **)(local_10 + 0x10);
    if (local_51 == '1') {
      poVar4 = std::operator<<((ostream *)&std::cout,"using pack()");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      if (local_51 != '2') {
        show_usage((ostream *)0x14b223);
        local_4 = 1;
        local_50 = 1;
        goto LAB_0014b680;
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"using rebuild()");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    StopWatch::StopWatch((StopWatch *)in_stack_fffffffffffffcb0);
    if (local_51 == '1') {
      pDVar5 = std::unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_>::operator->
                         ((unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)
                          0x14b26b);
      (*pDVar5->_vptr_Dictionary[7])();
    }
    else {
      pDVar5 = std::unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_>::operator->
                         ((unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)
                          0x14b2ae);
      (*pDVar5->_vptr_Dictionary[8])();
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"- rearrangement time: ");
    dVar6 = StopWatch::operator()(in_stack_fffffffffffffcf0,type);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,dVar6);
    poVar4 = std::operator<<(poVar4," sec");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    StopWatch::~StopWatch(&local_60);
    show_stat(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,(bool)in_stack_fffffffffffffd77);
    pcVar1 = *(char **)(local_10 + 0x20);
    paVar7 = (allocator *)&stack0xffffffffffffff7f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,pcVar1,paVar7);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
    std::__cxx11::string::operator+=(local_80,".");
    pcVar1 = *(char **)(local_10 + 0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,pcVar1,&local_c9);
    get_ext(in_stack_fffffffffffffcb8);
    std::__cxx11::string::operator+=(local_80,local_a8);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::ofstream::ofstream(local_2d0,local_80,0x10);
    bVar3 = std::ios::operator!((ios *)((long)local_2d0 + *(long *)(local_2d0[0] + -0x18)));
    bVar2 = (bVar3 & 1) != 0;
    if (bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"failed to open ");
      poVar4 = std::operator<<(poVar4,local_80);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      local_4 = 1;
    }
    else {
      pDVar5 = std::unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_>::operator->
                         ((unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)
                          0x14b5cd);
      (*pDVar5->_vptr_Dictionary[0xc])(pDVar5,local_2d0);
    }
    local_50 = (uint)bVar2;
    std::ofstream::~ofstream(local_2d0);
    if (local_50 == 0) {
      in_stack_fffffffffffffcb0 = std::operator<<((ostream *)&std::cout,"write dic to ");
      poVar4 = std::operator<<(in_stack_fffffffffffffcb0,local_80);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      local_4 = 0;
      local_50 = 1;
    }
    std::__cxx11::string::~string(local_80);
  }
  else {
    local_4 = 1;
    local_50 = 1;
  }
LAB_0014b680:
  std::unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_>::~unique_ptr
            ((unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)
             in_stack_fffffffffffffcb0);
  return local_4;
}

Assistant:

int run_rearrangement(int argc, const char* argv[]) {
  std::cout << "run rearrangement" << std::endl;

  if (argc < 5) {
    show_usage(std::cerr);
    return 1;
  }

  auto dic = read_dic(argv[3]);
  if (!dic) {
    return 1;
  }

  show_stat(std::cout, dic, false);

  auto rear_mode = *argv[2];
  if (rear_mode == '1') {
    std::cout << "using pack()" << std::endl;
  } else if (rear_mode == '2') {
    std::cout << "using rebuild()" << std::endl;
  } else {
    show_usage(std::cerr);
    return 1;
  }

  {
    StopWatch sw;
    if (rear_mode == '1') {
      dic->pack();
    } else {
      dic->rebuild();
    }
    std::cout << "- rearrangement time: " << sw(Times::sec) << " sec" << std::endl;
  }

  show_stat(std::cout, dic, false);

  std::string dic_name{argv[4]};
  dic_name += ".";
  dic_name += get_ext(argv[3]);

  {
    std::ofstream ofs{dic_name};
    if (!ofs) {
      std::cerr << "failed to open " << dic_name << std::endl;
      return 1;
    }
    dic->write(ofs);
  }
  std::cout << "write dic to " << dic_name << std::endl;

  return 0;
}